

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O2

void __thiscall
Refal2::CVariablesBuilder::errorTypesNotMatched
          (CVariablesBuilder *this,char name,TVariableType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x01');
  std::operator+(&local_98,"variable `",&local_b8);
  std::operator+(&local_78,&local_98,"` previously defined in rule with type `");
  if (type - VT_S < 4) {
    std::operator+(&local_58,&local_78,
                   &DAT_0013d0dc + *(int *)(&DAT_0013d0dc + (ulong)(type - VT_S) * 4));
    std::operator+(&local_38,&local_58,"`");
    error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                ,0x10f,"const char *Refal2::convertVariableTypeToTag(TVariableType)");
}

Assistant:

void CVariablesBuilder::errorTypesNotMatched( char name, TVariableType type )
{
	error( "variable `" + std::string( 1, name )
		+ "` previously defined in rule with type `"
		+ convertVariableTypeToTag( type ) + "`" );
}